

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Logger.hpp
# Opt level: O0

void __thiscall Logger::FileOutputSink::~FileOutputSink(FileOutputSink *this)

{
  ScopedLockT<Threading::FastLock> local_18;
  ScopedLock scope;
  FileOutputSink *this_local;
  
  (this->super_OutputSink)._vptr_OutputSink = (_func_int **)&PTR_checkFlags_0013cbe0;
  scope.lock = (FastLock *)this;
  Threading::ScopedLockT<Threading::FastLock>::ScopedLockT(&local_18,&this->lock);
  if (this->file != (FILE *)0x0) {
    fclose((FILE *)this->file);
  }
  this->file = (FILE *)0x0;
  Threading::ScopedLockT<Threading::FastLock>::~ScopedLockT(&local_18);
  Threading::FastLock::~FastLock(&this->lock);
  OutputSink::~OutputSink(&this->super_OutputSink);
  return;
}

Assistant:

~FileOutputSink() { Threading::ScopedLock scope(lock); if (file) fclose(file); file = 0; }